

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
xLearn::CSVParser::Parse(CSVParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  uint64 uVar1;
  ostream *poVar2;
  long lVar3;
  DMatrix *this_00;
  long lVar4;
  uint64 pos;
  ulong uVar5;
  index_t iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  allocator local_ae;
  allocator local_ad;
  Logger local_ac;
  uint64 local_a8;
  float local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_vec;
  string local_78;
  uint64 local_58;
  CSVParser *local_50;
  char *local_48;
  long local_40;
  uint64 local_38;
  
  local_50 = this;
  local_48 = buf;
  if (buf == (char *)0x0) {
    local_ac.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,&local_ad);
    std::__cxx11::string::string((string *)&str_vec,"Parse",&local_ae);
    poVar2 = Logger::Start(ERR,&local_78,0xcf,(string *)&str_vec);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xcf);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"buf");
    std::operator<<(poVar2," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        this_00 = matrix;
        DMatrix::Reset(matrix);
      }
      str_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      str_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      str_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pos = 0;
      local_58 = size;
      while( true ) {
        uVar1 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_48,pos,local_58);
        if (uVar1 == 0) break;
        DMatrix::AddRow(matrix);
        iVar6 = matrix->row_length;
        local_a8 = uVar1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&str_vec);
        std::__cxx11::string::string((string *)&local_78,line_buf,(allocator *)&local_ac);
        SplitStringUsing(&local_78,(local_50->super_Parser).splitor_._M_dataplus._M_p,&str_vec);
        local_38 = pos + local_a8;
        iVar6 = iVar6 - 1;
        std::__cxx11::string::~string((string *)&local_78);
        this_00 = (DMatrix *)
                  ((str_vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        uVar5 = (long)str_vec.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)str_vec.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        dVar7 = atof((char *)this_00);
        local_40 = (long)(int)iVar6;
        auVar8 = ZEXT816(0) << 0x40;
        (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[local_40] = (float)dVar7;
        lVar3 = 0x20;
        lVar4 = 0;
        while( true ) {
          if ((long)(int)(uVar5 >> 5) <= lVar4 + 1) break;
          local_a8 = CONCAT44(local_a8._4_4_,auVar8._0_4_);
          dVar7 = atof(*(char **)((long)&((str_vec.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar3));
          local_9c = (float)dVar7;
          this_00 = matrix;
          DMatrix::AddNode(matrix,iVar6,(index_t)lVar4,local_9c,0);
          lVar3 = lVar3 + 0x20;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)local_a8),ZEXT416((uint)local_9c),
                                   ZEXT416((uint)local_9c));
          lVar4 = lVar4 + 1;
        }
        (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[local_40] = 1.0 / auVar8._0_4_;
        pos = local_38;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&str_vec);
      return;
    }
    local_ac.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,&local_ad);
    std::__cxx11::string::string((string *)&str_vec,"Parse",&local_ae);
    poVar2 = Logger::Start(ERR,&local_78,0xd0,(string *)&str_vec);
    poVar2 = std::operator<<(poVar2,"CHECK_GT failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd0);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"size");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&str_vec);
  std::__cxx11::string::~string((string *)&local_78);
  Logger::~Logger(&local_ac);
  abort();
}

Assistant:

void CSVParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix, 
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  std::vector<std::string> str_vec;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    str_vec.clear();
    SplitStringUsing(line_buf, splitor_.c_str(), &str_vec);
    int size = str_vec.size();
    // Add Y
    matrix.Y[i] = atof(str_vec[0].c_str());
    // Add features
    real_t norm = 0.0;
    for (int j = 1; j < size; ++j) {
      index_t idx = j-1;
      real_t value = atof(str_vec[j].c_str());
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}